

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  uint uVar2;
  int lvalue;
  object l_init;
  functor j_init;
  fn m;
  fn k;
  fn l;
  fn j;
  fn i;
  fn h;
  fn g;
  fn f;
  fn e;
  fn d;
  fn c;
  fn b;
  fn a;
  int local_454;
  undefined1 local_450;
  undefined1 local_44f;
  undefined1 local_44e;
  undefined1 local_44d;
  int local_44c;
  undefined1 local_448 [80];
  undefined1 local_3f8 [80];
  undefined1 local_3a8 [80];
  undefined1 local_358 [80];
  undefined1 local_308 [80];
  undefined1 local_2b8 [80];
  undefined1 local_268 [80];
  undefined1 local_218 [80];
  undefined1 local_1c8 [80];
  undefined1 local_178 [80];
  undefined1 local_128 [80];
  undefined1 local_d8 [80];
  undefined1 local_88 [88];
  
  local_454 = 0;
  local_88[0x20] = false;
  local_88._56_8_ = functor::operator();
  local_88._64_8_ = 0;
  local_88._0_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::{lambda(auto:1)#1}::
       callable_base<int,int&,int>_const__;
  local_88._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_88._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_88._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::{lambda(auto:1&,auto:2&&)#1}
       ::callable_base<int,int&,int>___;
  local_d8._0_4_ = 1;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_88,&local_454,(int *)local_d8);
  if (iVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 1 failed!\n",0x1a);
  }
  uVar2 = (uint)(iVar1 != 1);
  local_d8[0x20] = false;
  local_d8._48_8_ = &local_44d;
  local_d8._56_8_ = functor::operator();
  local_d8._64_8_ = 0;
  local_d8._0_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::{lambda(auto:1)#1}::
       callable_base<int,int&,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_d8._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::{lambda(auto:1&,auto:2&&)#1}
       ::callable_base<int,int&,int>___;
  local_128._0_4_ = 2;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_d8,&local_454,(int *)local_128);
  if (iVar1 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 2 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_128[0x20] = false;
  local_128._56_8_ = object::method;
  local_128._64_8_ = 0;
  local_128._0_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
       {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  local_128._8_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_128._16_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_128._24_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  local_178._0_4_ = 3;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_128,&local_454,(int *)local_178);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 3 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_178[0x20] = false;
  local_178._48_8_ = &local_44e;
  local_178._56_8_ = object::method;
  local_178._64_8_ = 0;
  local_178._0_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
       {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  local_178._8_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_178._16_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_178._24_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  local_1c8._0_4_ = 4;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_178,&local_454,(int *)local_1c8);
  if (iVar1 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 4 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_1c8[0x20] = false;
  local_1c8._48_8_ = free_function;
  local_1c8._0_8_ = (deleter_function_pointer)0x0;
  local_1c8._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_1c8._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_1c8._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int&,int>___;
  local_218._0_4_ = 5;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_1c8,&local_454,(int *)local_218);
  if (iVar1 != 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 5 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_218[0x20] = false;
  local_218._48_8_ = object::static_method;
  local_218._0_8_ = (deleter_function_pointer)0x0;
  local_218._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_218._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_218._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int&,int>___;
  local_268._0_4_ = 6;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_218,&local_454,(int *)local_268);
  if (iVar1 != 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 6 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_268[0x20] = false;
  local_268._56_8_ =
       tmf::detail::
       member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:64:9),_int_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:64:9)::*)(int_&,_int)_const,_int,_int_&,_int>
       ::anon_class_1_0_00000001_for_m_object::operator();
  local_268._64_8_ = 0;
  local_268._0_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::{lambda(auto:1)#1}::
       callable_base<int,int&,int>_const__;
  local_268._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_268._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_268._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  local_2b8._0_4_ = 7;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_268,&local_454,(int *)local_2b8);
  if (iVar1 != 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 7 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_2b8[0x20] = false;
  local_2b8._48_8_ = main::anon_class_1_0_00000001::__invoke;
  local_2b8._0_8_ = (deleter_function_pointer)0x0;
  local_2b8._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_2b8._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_2b8._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int&,int>___;
  local_308._0_4_ = 8;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_2b8,&local_454,(int *)local_308);
  if (iVar1 != 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 8 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_308[0x20] = false;
  local_308._56_8_ =
       tmf::detail::
       member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:72:9),_int_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:72:9)::*)(int_&,_int)_const,_int,_int_&,_int>
       ::anon_class_8_1_54a39807_for_m_object::operator();
  local_308._64_8_ = 0;
  local_308._0_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::{lambda(auto:1)#1}::
       callable_base<int,int&,int>_const__;
  local_308._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_308._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_308._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  local_358._0_4_ = 9;
  local_308._48_8_ = local_268;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_308,&local_454,(int *)local_358);
  if (iVar1 != 9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 9 failed!\n",0x1a);
    uVar2 = uVar2 + 1;
  }
  local_358[0x20] = false;
  local_358._48_8_ = &local_44f;
  local_358._56_8_ = functor::operator();
  local_358._64_8_ = 0;
  local_358._0_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::{lambda(auto:1)#1}::
       callable_base<int,int&,int>_const__;
  local_358._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_358._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_358._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::{lambda(auto:1&,auto:2&&)#1}
       ::callable_base<int,int&,int>___;
  local_3f8._0_4_ = 10;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_358,&local_454,(int *)local_3f8);
  if (iVar1 != 10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 10 failed!\n",0x1b);
    uVar2 = uVar2 + 1;
  }
  local_3f8._56_8_ = operator_new(0x18);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00106cf0;
  local_3f8._48_8_ = local_3f8._56_8_ + 0x10;
  local_3f8[0x20] = false;
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_)->_M_use_count = 2;
  }
  local_3f8._64_8_ = functor::operator();
  local_3f8._72_8_ = 0;
  local_3f8._0_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  local_3f8._8_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_3f8._16_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_3f8._24_8_ =
       tmf::callable<int(int&,int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._56_8_);
  local_3a8._0_4_ = 0xb;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_3f8,&local_454,(int *)local_3a8);
  if (iVar1 != 0xb) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 11 failed!\n",0x1b);
    uVar2 = uVar2 + 1;
  }
  local_3a8[0x20] = false;
  local_3a8._48_8_ = &local_450;
  local_3a8._56_8_ = object::method;
  local_3a8._64_8_ = 0;
  local_3a8._0_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
       {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  local_3a8._8_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_3a8._16_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_3a8._24_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  local_448._0_4_ = 0xc;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_3a8,&local_454,(int *)local_448);
  if (iVar1 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 12 failed!\n",0x1b);
    uVar2 = uVar2 + 1;
  }
  local_448._56_8_ = operator_new(0x18);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00106d68;
  local_448._48_8_ = local_448._56_8_ + 0x10;
  local_448[0x20] = false;
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_)->_M_use_count = 2;
  }
  local_448._64_8_ = object::method;
  local_448._72_8_ = 0;
  local_448._0_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(std::shared_ptr<object>&&,int(object::*)(int&,int))
       ::{lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  local_448._8_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(std::shared_ptr<object>&&,int(object::*)(int&,int))
       ::{lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  local_448._16_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(std::shared_ptr<object>&&,int(object::*)(int&,int))
       ::{lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  local_448._24_8_ =
       tmf::callable<int(int&,int),32ul>::
       callable<object,int(object::*)(int&,int)>(std::shared_ptr<object>&&,int(object::*)(int&,int))
       ::{lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._56_8_);
  local_44c = 0xd;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()(local_448,&local_454,&local_44c);
  if (iVar1 != 0xd) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"call test: step 13 failed!\n",0x1b);
    uVar2 = uVar2 + 1;
  }
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_448);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_3a8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_3f8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_358);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_308);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_2b8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_268);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_218);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_1c8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_178);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_128);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_d8);
  tmf::callable<int_(int_&,_int),_32UL>::~callable((callable<int_(int_&,_int),_32UL> *)local_88);
  return uVar2;
}

Assistant:

int
main()
{
		using fn = tmf::callable<int(int&, int)>;
		int failures = 0;
		int lvalue = 0;

		// to initialize with a functor, provide a class instance
		// - you can provide an rvalue to have your instance possibly moved into the callable
		fn a{ functor{} };
		a(lvalue, 1) == 1 ? 0 : (std::cout << "call test: step 1 failed!\n", ++failures);

		// - you can provide an lvalue to have your instance copied into the callable
		functor b_init{};
		fn b{ b_init };
		b(lvalue, 2) == 2 ? 0 : (std::cout << "call test: step 2 failed!\n", ++failures);

		// to initialize with an arbitrary member function provide a class instance
		// and a pointer to member function
		// - you can provide an rvalue to have your instance possibly moved into the callable
		fn c{ object{}, &object::method };
		c(lvalue, 3) == 3 ? 0 : (std::cout << "call test: step 3 failed!\n", ++failures);

		// - you can provide an lvalue to have your instance copied into the callable
		object d_init{};
		fn d{ d_init, &object::method };
		d(lvalue, 4) == 4 ? 0 : (std::cout << "call test: step 4 failed!\n", ++failures);

		// to initialize with a free function, provide the address of a
		// free function or static member function
		fn e{ &free_function };
		e(lvalue, 5) == 5 ? 0 : (std::cout << "call test: step 5 failed!\n", ++failures);

		fn f{ &object::static_method };
		f(lvalue, 6) == 6 ? 0 : (std::cout << "call test: step 6 failed!\n", ++failures);

		// to initialize with a lambda, simply provide the lambda
		fn g{ [](int& out, int i) { out += 1; return i; } };
		g(lvalue, 7) == 7 ? 0 : (std::cout << "call test: step 7 failed!\n", ++failures);

		// if the lambda can be downcast to a function pointer, this can reduce the size of the stored callable
		fn h{ static_cast<int(*)(int&, int)>([](int& out, int i) { out += 1; return i; }) };
		h(lvalue, 8) == 8 ? 0 : (std::cout << "call test: step 8 failed!\n", ++failures);

		// lambdas can capture, but keep in mind how this might effect the size of the callable
		fn i{ [&g](int& out, int value) { return g(out, value); } };
		i(lvalue, 9) == 9 ? 0 : (std::cout << "call test: step 9 failed!\n", ++failures);

		// initialize with a raw pointer to avoid copies and moves
		functor j_init;
		fn j{ &j_init };
		j(lvalue, 10) == 10 ? 0 : (std::cout << "call test: step 10 failed!\n", ++failures);

		// shared_ptr is a safer way to avoid copies and moves
		fn k{ std::make_shared<functor>() };
		k(lvalue, 11) == 11 ? 0 : (std::cout << "call test: step 11 failed!\n", ++failures);

		// initialize with a raw pointer to avoid copies and moves
		object l_init;
		fn l{ &l_init, &object::method };
		l(lvalue, 12) == 12 ? 0 : (std::cout << "call test: step 12 failed!\n", ++failures);

		// shared_ptr is a safer way to avoid copies and moves
		fn m{ std::make_shared<object>(), &object::method };
		m(lvalue, 13) == 13 ? 0 : (std::cout << "call test: step 13 failed!\n", ++failures);

		return failures;
}